

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall icu_63::MessagePattern::skipDouble(MessagePattern *this,int32_t index)

{
  short sVar1;
  char16_t cVar2;
  uint uVar3;
  long lVar4;
  char16_t *pcVar5;
  
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  if (uVar3 <= (uint)index || (int)uVar3 <= index) {
    return index;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar5 = (this->msg).fUnion.fFields.fArray;
  }
  else {
    pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
  }
  lVar4 = (long)index;
  do {
    cVar2 = pcVar5[lVar4];
    if ((ushort)cVar2 < 0x30) {
      if (0x2e < (ushort)cVar2) {
        return index;
      }
      if ((0x680000000000U >> ((ulong)(ushort)cVar2 & 0x3f) & 1) == 0) {
        return index;
      }
    }
    else if ((((0x39 < (ushort)cVar2) && (cVar2 != L'E')) && (cVar2 != L'∞')) && (cVar2 != L'e'))
    {
      return index;
    }
    if ((long)(int)uVar3 <= lVar4 + 1) {
      return uVar3;
    }
    index = index + 1;
    lVar4 = lVar4 + 1;
  } while ((uint)index < uVar3);
  return uVar3;
}

Assistant:

int32_t
MessagePattern::skipDouble(int32_t index) {
    int32_t msgLength=msg.length();
    while(index<msgLength) {
        UChar c=msg.charAt(index);
        // U+221E: Allow the infinity symbol, for ChoiceFormat patterns.
        if((c<0x30 && c!=u_plus && c!=u_minus && c!=u_dot) || (c>0x39 && c!=u_e && c!=u_E && c!=0x221e)) {
            break;
        }
        ++index;
    }
    return index;
}